

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)13>_> * __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::createImageView
          (Move<vk::Handle<(vk::HandleType)13>_> *__return_storage_ptr__,
          ImageClearingTestInstance *this,VkImage image,VkImageViewType viewType,VkFormat format,
          VkImageAspectFlags aspectMask)

{
  undefined1 local_80 [8];
  VkImageViewCreateInfo imageViewCreateInfo;
  VkImageAspectFlags aspectMask_local;
  VkFormat format_local;
  VkImageViewType viewType_local;
  ImageClearingTestInstance *this_local;
  VkImage image_local;
  
  local_80._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  imageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageViewCreateInfo._4_4_ = 0;
  imageViewCreateInfo.pNext._0_4_ = 0;
  imageViewCreateInfo.viewType = VK_IMAGE_VIEW_TYPE_1D;
  imageViewCreateInfo.format = VK_FORMAT_UNDEFINED;
  imageViewCreateInfo.components.r = VK_COMPONENT_SWIZZLE_IDENTITY;
  imageViewCreateInfo.components.g = VK_COMPONENT_SWIZZLE_IDENTITY;
  imageViewCreateInfo.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  imageViewCreateInfo.subresourceRange.aspectMask = 1;
  imageViewCreateInfo.subresourceRange.baseMipLevel = 0;
  imageViewCreateInfo.subresourceRange.levelCount = 1;
  imageViewCreateInfo._16_8_ = image.m_internal;
  imageViewCreateInfo.image.m_internal._0_4_ = viewType;
  imageViewCreateInfo.image.m_internal._4_4_ = format;
  imageViewCreateInfo.components.b = aspectMask;
  imageViewCreateInfo._76_4_ = aspectMask;
  ::vk::createImageView
            (__return_storage_ptr__,this->m_vkd,this->m_device,(VkImageViewCreateInfo *)local_80,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkImageView> ImageClearingTestInstance::createImageView (VkImage image, VkImageViewType viewType, VkFormat format, VkImageAspectFlags aspectMask) const
{
	const VkImageViewCreateInfo				imageViewCreateInfo		=
	{
		VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType				sType;
		DE_NULL,									// const void*					pNext;
		0u,											// VkImageViewCreateFlags		flags;
		image,										// VkImage						image;
		viewType,									// VkImageViewType				viewType;
		format,										// VkFormat						format;
		{
			VK_COMPONENT_SWIZZLE_IDENTITY,				// VkComponentSwizzle			r;
			VK_COMPONENT_SWIZZLE_IDENTITY,				// VkComponentSwizzle			g;
			VK_COMPONENT_SWIZZLE_IDENTITY,				// VkComponentSwizzle			b;
			VK_COMPONENT_SWIZZLE_IDENTITY,				// VkComponentSwizzle			a;
		},											// VkComponentMapping			components;
		{
			aspectMask,									// VkImageAspectFlags			aspectMask;
			0u,											// deUint32						baseMipLevel;
			1u,											// deUint32						mipLevels;
			0u,											// deUint32						baseArrayLayer;
			1u,											// deUint32						arraySize;
		},											// VkImageSubresourceRange		subresourceRange;
	};

	return vk::createImageView(m_vkd, m_device, &imageViewCreateInfo, DE_NULL);
}